

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O3

void __thiscall libchars::edit_object::~edit_object(edit_object *this)

{
  ~edit_object(this);
  operator_delete(this,0x4050);
  return;
}

Assistant:

virtual ~edit_object() {
            // securely wipe contents of buffer
            if (buflen > 0) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > 0) {
                    *p-- = 0;
                    --buflen;
                }
            }
        }